

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basiclu_factorize.c
# Opt level: O0

lu_int basiclu_factorize(lu_int *istore,double *xstore,lu_int *Li,double *Lx,lu_int *Ui,double *Ux,
                        lu_int *Wi,double *Wx,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx,
                        lu_int c0ntinue)

{
  lu_int lVar1;
  long in_RCX;
  lu *this_00;
  long in_RDX;
  double *in_RSI;
  lu_int *in_RDI;
  long in_R8;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  double factor_cost;
  int in_stack_00000038;
  lu_int status;
  lu this;
  lu_int *in_stack_fffffffffffffce0;
  double *in_stack_fffffffffffffce8;
  lu_int *in_stack_fffffffffffffcf0;
  double *in_stack_fffffffffffffcf8;
  uint in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  lu *in_stack_fffffffffffffd08;
  lu_int *in_stack_fffffffffffffd10;
  lu_int *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  lu_int in_stack_fffffffffffffd24;
  lu_int *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  double *in_stack_fffffffffffffd38;
  double *in_stack_fffffffffffffd40;
  double *in_stack_fffffffffffffd48;
  int local_2a4;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  lu_int *in_stack_fffffffffffffd78;
  lu_int *in_stack_fffffffffffffd80;
  lu_int *in_stack_fffffffffffffd88;
  lu *in_stack_fffffffffffffd90;
  double *in_stack_fffffffffffffda8;
  lu_int *in_stack_fffffffffffffdb0;
  lu_int *in_stack_fffffffffffffdb8;
  lu_int *in_stack_fffffffffffffdc0;
  lu *in_stack_fffffffffffffdc8;
  lu *in_stack_fffffffffffffe08;
  int local_1bc;
  int local_180;
  double *in_stack_fffffffffffffea8;
  lu_int *in_stack_fffffffffffffeb0;
  lu_int *in_stack_fffffffffffffeb8;
  lu_int *in_stack_fffffffffffffec0;
  lu *in_stack_fffffffffffffec8;
  
  lVar1 = lu_load(in_stack_fffffffffffffd08,
                  (lu_int *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                  in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                  in_stack_fffffffffffffce0,
                  (double *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                  in_stack_fffffffffffffd28,
                  (double *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
  if (lVar1 != 0) {
    return lVar1;
  }
  if ((((((in_RDX == 0) || (in_RCX == 0)) || (in_R8 == 0)) ||
       ((in_R9 == 0 || (in_stack_00000008 == 0)))) ||
      ((in_stack_00000010 == 0 || ((in_stack_00000018 == 0 || (in_stack_00000020 == 0)))))) ||
     ((in_stack_00000028 == 0 || (factor_cost == 0.0)))) {
    lVar1 = lu_save(&stack0xfffffffffffffd08,in_RDI,in_RSI,-3);
    return lVar1;
  }
  if (in_stack_00000038 == 0) {
    lu_reset((lu *)0x85a156);
    local_180 = 1;
  }
  this_00 = (lu *)(ulong)(local_180 - 1);
  switch(this_00) {
  case (lu *)0x0:
    lVar1 = lu_singletons(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                          in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                          in_stack_fffffffffffffea8);
    if (lVar1 != 0) goto LAB_0085a4a0;
    break;
  case (lu *)0x1:
    break;
  case (lu *)0x2:
    goto LAB_0085a25c;
  case (lu *)0x3:
    goto LAB_0085a283;
  default:
    lVar1 = lu_save(&stack0xfffffffffffffd08,in_RDI,in_RSI,-2);
    return lVar1;
  }
  lVar1 = lu_setup_bump(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0,
                        in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                        in_stack_fffffffffffffda8);
  if (lVar1 == 0) {
LAB_0085a25c:
    lVar1 = lu_factorize_bump(this_00);
    if (lVar1 == 0) {
LAB_0085a283:
      lVar1 = lu_build_factors(in_stack_fffffffffffffe08);
      if (lVar1 == 0) {
        in_stack_fffffffffffffd74 = in_stack_fffffffffffffd74 + 1;
        lu_condest(in_stack_fffffffffffffd24,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (double *)in_stack_fffffffffffffd08,(double *)(ulong)in_stack_fffffffffffffd00,
                   (lu_int *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
        lu_condest(in_stack_fffffffffffffd24,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                   (double *)in_stack_fffffffffffffd08,
                   (double *)CONCAT44(lVar1,in_stack_fffffffffffffd00),
                   (lu_int *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffd30,
                   in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48);
        lu_residual_test(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                         in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         (double *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70));
        if (local_1bc < local_2a4) {
          lVar1 = 2;
        }
      }
    }
  }
LAB_0085a4a0:
  lVar1 = lu_save(&stack0xfffffffffffffd08,in_RDI,in_RSI,lVar1);
  return lVar1;
}

Assistant:

lu_int basiclu_factorize
(
    lu_int istore[],
    double xstore[],
    lu_int Li[],
    double Lx[],
    lu_int Ui[],
    double Ux[],
    lu_int Wi[],
    double Wx[],
    const lu_int Bbegin[],
    const lu_int Bend[],
    const lu_int Bi[],
    const double Bx[],
    lu_int c0ntinue
)
{
    struct lu this;
    lu_int status;
    double factor_cost;

    status = lu_load(&this, istore, xstore, Li, Lx, Ui, Ux, Wi, Wx);
    if (status != BASICLU_OK)
        return status;

    if (! (Li && Lx && Ui && Ux && Wi && Wx && Bbegin && Bend && Bi && Bx))
    {
        status = BASICLU_ERROR_argument_missing;
        return lu_save(&this, istore, xstore, status);
    }
    if (!c0ntinue)
    {
        lu_reset(&this);
        this.task = SINGLETONS;
    }

    /* continue factorization */
    switch (this.task)
    {
    case SINGLETONS: goto singletons;
    case SETUP_BUMP: goto setup_bump;
    case FACTORIZE_BUMP: goto factorize_bump;
    case BUILD_FACTORS: goto build_factors;
    }
    status = BASICLU_ERROR_invalid_call;
    return lu_save(&this, istore, xstore, status);

    /*
     * Each of the following four parts of the factorization calls a routine
     * lu_do_something() which may request reallocation. In this case return
     * to the caller immediately, keeping the entry point in this.task.
     */

singletons:
    this.task = SINGLETONS;
    status = lu_singletons(&this, Bbegin, Bend, Bi, Bx);
    if (status != BASICLU_OK)
        goto return_to_caller;

setup_bump:
    this.task = SETUP_BUMP;
    status = lu_setup_bump(&this, Bbegin, Bend, Bi, Bx);
    if (status != BASICLU_OK)
        goto return_to_caller;

factorize_bump:
    this.task = FACTORIZE_BUMP;
    status = lu_factorize_bump(&this);
    if (status != BASICLU_OK)
        goto return_to_caller;

build_factors:
    this.task = BUILD_FACTORS;
    status = lu_build_factors(&this);
    if (status != BASICLU_OK)
        goto return_to_caller;

    /* factorization successfully finished */
    this.task               = NO_TASK;
    this.nupdate            =  0; /* make factorization valid */
    this.ftran_for_update   = -1;
    this.btran_for_update   = -1;
    this.nfactorize++;

    this.condestL = lu_condest(this.m, this.Lbegin, this.Lindex, this.Lvalue,
                               NULL, this.p, 0, this.work1,
                               &this.normL, &this.normestLinv);
    this.condestU = lu_condest(this.m, this.Ubegin, this.Uindex, this.Uvalue,
                               this.row_pivot, this.p, 1, this.work1,
                               &this.normU, &this.normestUinv);

    /* measure numerical stability of the factorization */
    lu_residual_test(&this, Bbegin, Bend, Bi, Bx);

    /*
     * factor_cost is a deterministic measure of the factorization cost.
     * The parameters have been adjusted such that (on my computer)
     * 1e-6 * factor_cost =~ time_factorize.
     *
     * update_cost measures the accumulated cost of updates/solves compared
     * to the last factorization. It is computed from
     *
     *   update_cost = update_cost_numer / update_cost_denom.
     *
     * update_cost_denom is fixed here.
     * update_cost_numer is zero here and increased by solves/updates.
     *
     */
    factor_cost =
        0.04 * this.m +
        0.07 * this.matrix_nz +
        0.20 * this.bump_nz +
        0.20 * this.nsearch_pivot +
        0.008 * this.factor_flops;

    this.update_cost_denom = factor_cost * 250;

    if (this.rank < this.m)
        status = BASICLU_WARNING_singular_matrix;

return_to_caller:
    return lu_save(&this, istore, xstore, status);
}